

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O0

void __thiscall MismatchedTokenException::MismatchedTokenException(MismatchedTokenException *this)

{
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffff88;
  ParserException *in_stack_ffffffffffffff90;
  AST *p;
  RefCount<AST> *in_stack_ffffffffffffffc0;
  allocator<char> local_29;
  string local_28 [4];
  int in_stack_ffffffffffffffdc;
  BitSet *in_stack_ffffffffffffffe0;
  
  p = (AST *)&local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Mismatched Token: expecting any AST node",(allocator *)p);
  ParserException::ParserException(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  *in_RDI = &PTR__MismatchedTokenException_0036ccd0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x297f7c);
  RefCount<Token>::RefCount((RefCount<Token> *)in_stack_ffffffffffffffc0,(Token *)p);
  RefCount<AST>::RefCount(in_stack_ffffffffffffffc0,p);
  std::__cxx11::string::string((string *)(in_RDI + 0xb));
  BitSet::BitSet(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException()
: ParserException("Mismatched Token: expecting any AST node")
, token(0)
, node(0)
{}